

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

matrix3f * __thiscall tinyusdz::value::matrix3f::operator=(matrix3f *this,matrix3d *src)

{
  ulong local_28;
  size_t i;
  size_t j;
  matrix3d *src_local;
  matrix3f *this_local;
  
  for (i = 0; i < 3; i = i + 1) {
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      this->m[i][local_28] = (float)src->m[i][local_28];
    }
  }
  return this;
}

Assistant:

matrix3f &matrix3f::operator=(const matrix3d &src) {

  for (size_t j = 0; j < 3; j++) {
    for (size_t i = 0; i < 3; i++) {
      m[j][i] = float(src.m[j][i]);
    }
  }

  return *this;
}